

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zg.cc
# Opt level: O0

state_sptr_t __thiscall
tchecker::zg::zg_t::clone_and_constrain(zg_t *this,const_state_sptr_t *s,clock_constraint_t *c)

{
  bool bVar1;
  state_t *psVar2;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_> *piVar3
  ;
  zone_t *pzVar4;
  db_t *dbm;
  size_t sVar5;
  clock_constraint_t *in_RCX;
  clock_constraint_t *c_local;
  const_state_sptr_t *s_local;
  zg_t *this_local;
  state_sptr_t *clone_s;
  
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
  ::operator*((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
               *)c);
  details::
  state_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>::
  clone<>((state_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
           *)this,(make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL> *)(s + 0xe));
  psVar2 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
            ::operator->((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                          *)this)->super_state_t;
  piVar3 = state_t::zone_ptr(psVar2);
  pzVar4 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
            ::operator->(piVar3)->super_zone_t;
  dbm = zone_t::dbm(pzVar4);
  psVar2 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
            ::operator->((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                          *)this)->super_state_t;
  piVar3 = state_t::zone_ptr(psVar2);
  pzVar4 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
            ::operator->(piVar3)->super_zone_t;
  sVar5 = zone_t::dim(pzVar4);
  tchecker::dbm::constrain(dbm,(clock_id_t)sVar5,in_RCX);
  psVar2 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
            ::operator->((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                          *)this)->super_state_t;
  pzVar4 = state_t::zone(psVar2);
  bVar1 = zone_t::is_empty(pzVar4);
  if ((!bVar1) && (*(int *)&s[9]._t == 1)) {
    share((zg_t *)s,(state_sptr_t *)this);
  }
  return (state_sptr_t)(make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL> *)this;
}

Assistant:

tchecker::zg::state_sptr_t zg_t::clone_and_constrain(tchecker::zg::const_state_sptr_t const & s,
                                                     tchecker::clock_constraint_t const & c)
{
  tchecker::zg::state_sptr_t clone_s = _state_allocator.clone(*s);
  tchecker::dbm::constrain(clone_s->zone_ptr()->dbm(), clone_s->zone_ptr()->dim(), c);
  if (!clone_s->zone().is_empty() && _sharing_type == tchecker::ts::SHARING)
    share(clone_s);
  return clone_s;
}